

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_char>,unsigned_char,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t iVar16;
  ulong uVar17;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      lVar3 = *(long *)(input + 0x20);
      lVar4 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      lVar6 = *(long *)(input + 0x28);
      if (lVar6 == 0) {
        if (count == 0) {
          return;
        }
        iVar14 = 0;
        do {
          pcVar5 = *(char **)(lVar4 + iVar14 * 8);
          bVar13 = *(byte *)(lVar3 + iVar14);
          if (*pcVar5 == '\0') {
            *pcVar5 = '\x01';
          }
          else {
            bVar13 = bVar13 ^ pcVar5[1];
          }
          pcVar5[1] = bVar13;
          iVar14 = iVar14 + 1;
        } while (count != iVar14);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar8 = 0;
      uVar11 = 0;
      do {
        uVar7 = *(ulong *)(lVar6 + uVar8 * 8);
        uVar10 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar10 = count;
        }
        uVar12 = uVar10;
        if (uVar7 != 0) {
          uVar12 = uVar11;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar11 < uVar10) {
              do {
                pcVar5 = *(char **)(lVar4 + uVar11 * 8);
                bVar13 = *(byte *)(lVar3 + uVar11);
                if (*pcVar5 == '\0') {
                  *pcVar5 = '\x01';
                }
                else {
                  bVar13 = bVar13 ^ pcVar5[1];
                }
                pcVar5[1] = bVar13;
                uVar11 = uVar11 + 1;
                uVar12 = uVar10;
              } while (uVar10 != uVar11);
            }
          }
          else if (uVar11 < uVar10) {
            uVar17 = 0;
            do {
              if ((uVar7 >> (uVar17 & 0x3f) & 1) != 0) {
                pcVar5 = *(char **)(lVar4 + uVar11 * 8 + uVar17 * 8);
                bVar13 = *(byte *)(lVar3 + uVar11 + uVar17);
                if (*pcVar5 == '\0') {
                  pcVar5[1] = bVar13;
                  *pcVar5 = '\x01';
                }
                else {
                  pcVar5[1] = pcVar5[1] ^ bVar13;
                }
              }
              uVar17 = uVar17 + 1;
              uVar12 = uVar10;
            } while (uVar10 - uVar11 != uVar17);
          }
        }
        uVar8 = uVar8 + 1;
        uVar11 = uVar12;
      } while (uVar8 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    pbVar1 = *(byte **)(input + 0x20);
    pbVar2 = (byte *)**(undefined8 **)(states + 0x20);
    bVar13 = *pbVar2;
    do {
      bVar9 = *pbVar1;
      if ((bVar13 & 1) == 0) {
        *pbVar2 = 1;
        bVar13 = 1;
      }
      else {
        bVar9 = bVar9 ^ pbVar2[1];
      }
      pbVar2[1] = bVar9;
      count = count - 1;
    } while (count != 0);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_a8 == 0) {
    if (count != 0) {
      lVar3 = *local_b8;
      lVar4 = *local_70;
      iVar14 = 0;
      do {
        iVar15 = iVar14;
        if (lVar3 != 0) {
          iVar15 = (idx_t)*(uint *)(lVar3 + iVar14 * 4);
        }
        iVar16 = iVar14;
        if (lVar4 != 0) {
          iVar16 = (idx_t)*(uint *)(lVar4 + iVar14 * 4);
        }
        pcVar5 = *(char **)(local_68 + iVar16 * 8);
        bVar13 = *(byte *)(local_b0 + iVar15);
        if (*pcVar5 == '\0') {
          *pcVar5 = '\x01';
        }
        else {
          bVar13 = bVar13 ^ pcVar5[1];
        }
        pcVar5[1] = bVar13;
        iVar14 = iVar14 + 1;
      } while (count != iVar14);
    }
  }
  else if (count != 0) {
    lVar3 = *local_b8;
    lVar4 = *local_70;
    iVar14 = 0;
    do {
      iVar15 = iVar14;
      if (lVar3 != 0) {
        iVar15 = (idx_t)*(uint *)(lVar3 + iVar14 * 4);
      }
      iVar16 = iVar14;
      if (lVar4 != 0) {
        iVar16 = (idx_t)*(uint *)(lVar4 + iVar14 * 4);
      }
      if ((*(ulong *)(local_a8 + (iVar15 >> 6) * 8) >> (iVar15 & 0x3f) & 1) != 0) {
        pcVar5 = *(char **)(local_68 + iVar16 * 8);
        if (*pcVar5 == '\0') {
          pcVar5[1] = *(byte *)(local_b0 + iVar15);
          *pcVar5 = '\x01';
        }
        else {
          pcVar5[1] = pcVar5[1] ^ *(byte *)(local_b0 + iVar15);
        }
      }
      iVar14 = iVar14 + 1;
    } while (count != iVar14);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}